

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O1

void ssh2_userauth_add_alg_and_publickey
               (ssh2_userauth_state *s,PktOut *pkt,ptrlen alg,ptrlen pkblob)

{
  LogContext *pLVar1;
  ptrlen pl1;
  ptrlen blob;
  ptrlen pVar2;
  ptrlen pl2;
  ptrlen pl;
  ptrlen pl2_00;
  ptrlen pl1_00;
  bool bVar3;
  _Bool _Var4;
  _Bool _Var5;
  ssh_keyalg *psVar6;
  strbuf *psVar7;
  strbuf *psVar8;
  ssh_keyalg *psVar9;
  ssh_key *psVar10;
  ssh_key *psVar11;
  char *pcVar12;
  char *pcVar13;
  strbuf *local_70;
  ssh_key *local_68;
  
  psVar7 = s->detached_cert_blob;
  if (psVar7 == (strbuf *)0x0) goto LAB_0011b876;
  pVar2.ptr = psVar7->u;
  pVar2.len = psVar7->len;
  blob.ptr = psVar7->u;
  blob.len = psVar7->len;
  psVar6 = find_pubkey_alg_len(alg);
  psVar7 = strbuf_new();
  if (s->cert_pubkey_diagnosed == (strbuf *)0x0) {
    psVar8 = strbuf_new();
    s->cert_pubkey_diagnosed = psVar8;
  }
  pl1.ptr = s->cert_pubkey_diagnosed->u;
  pl1.len = s->cert_pubkey_diagnosed->len;
  _Var4 = ptrlen_eq_ptrlen(pl1,pkblob);
  if (!_Var4) {
    strbuf_shrink_to(s->cert_pubkey_diagnosed,0);
    BinarySink_put_datapl(s->cert_pubkey_diagnosed->binarysink_,pkblob);
  }
  psVar9 = pubkey_blob_to_alg(blob);
  if (psVar9 == (ssh_keyalg *)0x0) {
    __assert_fail("certalg",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/userauth2-client.c"
                  ,0x767,
                  "void ssh2_userauth_add_alg_and_publickey(struct ssh2_userauth_state *, PktOut *, ptrlen, ptrlen)"
                 );
  }
  if (psVar9->is_certificate == false) {
    __assert_fail("certalg->is_certificate",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/userauth2-client.c"
                  ,0x768,
                  "void ssh2_userauth_add_alg_and_publickey(struct ssh2_userauth_state *, PktOut *, ptrlen, ptrlen)"
                 );
  }
  psVar10 = (*psVar9->new_pub)(psVar9,pVar2);
  if (psVar10 == (ssh_key *)0x0) {
    pcVar12 = "certificate key file is invalid";
    local_68 = (ssh_key *)0x0;
    local_70 = (strbuf *)0x0;
    psVar8 = (strbuf *)0x0;
LAB_0011b756:
    BinarySink_put_fmt(psVar7->binarysink_,pcVar12);
    if (!_Var4) {
      pLVar1 = (s->ppl).logctx;
      pcVar12 = filename_to_str(s->detached_cert_file);
      pcVar12 = dupprintf("Not substituting certificate \"%s\" for public key: %s",pcVar12,psVar7->s
                         );
      logevent_and_free(pLVar1,pcVar12);
      if (s->publickey_blob != (strbuf *)0x0) {
        pcVar12 = filename_to_str(s->detached_cert_file);
        pcVar13 = filename_to_str(s->keyfile);
        pcVar12 = dupprintf("Unable to use certificate \"%s\" with public key \"%s\": %s\r\n",
                            pcVar12,pcVar13,psVar7->s);
        ssh_ppl_user_output_string_and_free(&s->ppl,pcVar12);
      }
    }
    bVar3 = false;
  }
  else {
    psVar8 = strbuf_new();
    psVar11 = (*psVar10->vt->base_key)(psVar10);
    (*psVar11->vt->public_blob)(psVar11,psVar8->binarysink_);
    pl2.ptr = psVar8->u;
    pl2.len = psVar8->len;
    _Var5 = ptrlen_eq_ptrlen(pkblob,pl2);
    if (!_Var5) {
      if (psVar6 == (ssh_keyalg *)0x0) {
        pcVar12 = "unable to identify algorithm of base key";
      }
      else {
        local_68 = (*psVar6->new_pub)(psVar6,pkblob);
        if (local_68 != (ssh_key *)0x0) {
          local_70 = strbuf_new();
          psVar11 = (*local_68->vt->base_key)(local_68);
          (*psVar11->vt->public_blob)(psVar11,local_70->binarysink_);
          pl1_00.ptr = local_70->u;
          pl1_00.len = local_70->len;
          pl2_00.ptr = psVar8->u;
          pl2_00.len = psVar8->len;
          _Var5 = ptrlen_eq_ptrlen(pl1_00,pl2_00);
          if (!_Var5) {
            pcVar12 = "base public key does not match certificate";
            goto LAB_0011b756;
          }
          goto LAB_0011b610;
        }
        pcVar12 = "base public key is invalid";
      }
      local_68 = (ssh_key *)0x0;
      local_70 = (strbuf *)0x0;
      goto LAB_0011b756;
    }
    local_68 = (ssh_key *)0x0;
    local_70 = (strbuf *)0x0;
LAB_0011b610:
    if (!_Var4) {
      pLVar1 = (s->ppl).logctx;
      pcVar12 = filename_to_str(s->detached_cert_file);
      pcVar12 = dupprintf("Sending public key with certificate from \"%s\"",pcVar12);
      logevent_and_free(pLVar1,pcVar12);
    }
    psVar6 = (*psVar9->related_alg)(psVar9,psVar6);
    BinarySink_put_stringz(pkt->binarysink_,psVar6->ssh_id);
    pl.ptr = s->detached_cert_blob->u;
    pl.len = s->detached_cert_blob->len;
    BinarySink_put_stringpl(pkt->binarysink_,pl);
    bVar3 = true;
  }
  if (psVar8 != (strbuf *)0x0) {
    strbuf_free(psVar8);
  }
  if (local_70 != (strbuf *)0x0) {
    strbuf_free(local_70);
  }
  if (psVar10 != (ssh_key *)0x0) {
    (*psVar10->vt->freekey)(psVar10);
  }
  if (local_68 != (ssh_key *)0x0) {
    (*local_68->vt->freekey)();
  }
  strbuf_free(psVar7);
  if (bVar3) {
    return;
  }
LAB_0011b876:
  BinarySink_put_stringpl(pkt->binarysink_,alg);
  BinarySink_put_stringpl(pkt->binarysink_,pkblob);
  return;
}

Assistant:

static void ssh2_userauth_add_alg_and_publickey(
    struct ssh2_userauth_state *s, PktOut *pkt, ptrlen alg, ptrlen pkblob)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */

    if (s->detached_cert_blob) {
        ptrlen detached_cert_pl = ptrlen_from_strbuf(s->detached_cert_blob);
        strbuf *certbase = NULL, *pkbase = NULL;
        bool done = false;
        const ssh_keyalg *pkalg = find_pubkey_alg_len(alg);
        ssh_key *certkey = NULL, *pk = NULL;
        strbuf *fail_reason = strbuf_new();
        bool verbose = true;

        /*
         * Whether or not we send the certificate, we're likely to
         * generate a log message about it. But we don't want to log
         * once for the offer and once for the real auth attempt, so
         * we de-duplicate by remembering the last public key this
         * function saw. */
        if (!s->cert_pubkey_diagnosed)
            s->cert_pubkey_diagnosed = strbuf_new();
        if (ptrlen_eq_ptrlen(ptrlen_from_strbuf(s->cert_pubkey_diagnosed),
                             pkblob)) {
            verbose = false;
        } else {
            /* Log this time, but arrange that we don't mention it next time */
            strbuf_clear(s->cert_pubkey_diagnosed);
            put_datapl(s->cert_pubkey_diagnosed, pkblob);
        }

        /*
         * Check that the public key we're replacing is compatible
         * with the certificate, in that they should have the same
         * base public key.
         */

        const ssh_keyalg *certalg = pubkey_blob_to_alg(detached_cert_pl);
        assert(certalg); /* we checked this before setting s->detached_blob */
        assert(certalg->is_certificate); /* and this too */

        certkey = ssh_key_new_pub(certalg, detached_cert_pl);
        if (!certkey) {
            put_fmt(fail_reason, "certificate key file is invalid");
            goto no_match;
        }

        certbase = strbuf_new();
        ssh_key_public_blob(ssh_key_base_key(certkey),
                            BinarySink_UPCAST(certbase));
        if (ptrlen_eq_ptrlen(pkblob, ptrlen_from_strbuf(certbase)))
            goto match;                /* yes, a match! */

        /*
         * If we reach here, the certificate's base key was not
         * identical to the key we're given. But it might still be
         * identical to the _base_ key of the key we're given, if we
         * were using a differently certified version of the same key.
         * In that situation, the detached cert should still override.
         */
        if (!pkalg) {
            put_fmt(fail_reason, "unable to identify algorithm of base key");
            goto no_match;
        }

        pk = ssh_key_new_pub(pkalg, pkblob);
        if (!pk) {
            put_fmt(fail_reason, "base public key is invalid");
            goto no_match;
        }

        pkbase = strbuf_new();
        ssh_key_public_blob(ssh_key_base_key(pk), BinarySink_UPCAST(pkbase));
        if (ptrlen_eq_ptrlen(ptrlen_from_strbuf(pkbase),
                             ptrlen_from_strbuf(certbase)))
            goto match;                /* yes, a match on 2nd attempt! */

        /* Give up; we've tried to match these keys up and failed. */
        put_fmt(fail_reason, "base public key does not match certificate");
        goto no_match;

      match:
        /*
         * The two keys match, so insert the detached certificate into
         * the output packet in place of the public key we were given.
         *
         * However, we need to be a bit careful with the algorithm
         * name: we might need to upgrade it to one that matches the
         * original algorithm name. (If we were asked to add an
         * ssh-rsa key but were given algorithm name "rsa-sha2-512",
         * then instead of the certificate's algorithm name
         * ssh-rsa-cert-v01@... we need to write the corresponding
         * SHA-512 name rsa-sha2-512-cert-v01@... .)
         */
        if (verbose) {
            ppl_logevent("Sending public key with certificate from \"%s\"",
                         filename_to_str(s->detached_cert_file));
        }
        put_stringz(pkt, ssh_keyalg_related_alg(certalg, pkalg)->ssh_id);
        put_stringpl(pkt, ptrlen_from_strbuf(s->detached_cert_blob));
        done = true;
        goto out;

      no_match:
        /* Log that we didn't send the certificate, if this public key
         * isn't the same one as last call to this function. (Need to
         * avoid verbosely logging once for the offer and once for the
         * real auth attempt.) */
	if (verbose) {
            ppl_logevent("Not substituting certificate \"%s\" for public "
                         "key: %s", filename_to_str(s->detached_cert_file),
                         fail_reason->s);
            if (s->publickey_blob) {
                /* If the user provided a specific key file to use (i.e.
                 * this wasn't just a key we picked opportunistically out
                 * of an agent), then they probably _care_ that we didn't
                 * send the certificate, so we should make a loud error
                 * message about it as well as just commenting in the
                 * Event Log. */
                ppl_printf("Unable to use certificate \"%s\" with public "
                           "key \"%s\": %s\r\n",
                           filename_to_str(s->detached_cert_file),
                           filename_to_str(s->keyfile),
                           fail_reason->s);
            }
        }

      out:
        /* Whether we did that or not, free our stuff. */
        if (certbase)
            strbuf_free(certbase);
        if (pkbase)
            strbuf_free(pkbase);
        if (certkey)
            ssh_key_free(certkey);
        if (pk)
            ssh_key_free(pk);
        strbuf_free(fail_reason);

        /* And if we did, don't fall through to the alternative below */
        if (done)
            return;
    }

    /* In all other cases, just put in what we were given. */
    put_stringpl(pkt, alg);
    put_stringpl(pkt, pkblob);
}